

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wiz-stats.c
# Opt level: O3

void stat_grid_counter_simple(chunk_conflict *c,grid_counts *counts)

{
  long lVar1;
  undefined **ppuVar2;
  neighbor_counter_pred *pnVar3;
  byte bVar4;
  neighbor_counter_pred npreds [1];
  grid_counter_pred gpreds [13];
  neighbor_counter_pred nStack_1d8;
  grid_counter_pred local_158;
  wchar_t local_138;
  wchar_t local_134;
  wchar_t local_130;
  wchar_t local_120;
  wchar_t local_11c;
  wchar_t local_118;
  wchar_t local_108;
  wchar_t local_104;
  wchar_t local_100;
  wchar_t local_f0;
  wchar_t local_ec;
  wchar_t local_e8;
  wchar_t local_d8;
  wchar_t local_d4;
  wchar_t local_d0;
  wchar_t local_c0;
  wchar_t local_bc;
  wchar_t local_b8;
  wchar_t local_a8;
  wchar_t local_a4;
  wchar_t local_a0;
  wchar_t local_90;
  wchar_t local_8c;
  wchar_t local_88;
  wchar_t local_78;
  wchar_t local_74;
  wchar_t local_70;
  wchar_t local_60;
  wchar_t local_5c;
  wchar_t local_58;
  wchar_t local_48;
  wchar_t local_44;
  wchar_t local_40;
  wchar_t local_30;
  wchar_t local_2c;
  wchar_t local_28;
  
  bVar4 = 0;
  memcpy(&local_158,&PTR_square_isfloor_002d0f30,0x138);
  ppuVar2 = &PTR_is_easily_traversed_002d1070;
  pnVar3 = &nStack_1d8;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    pnVar3->pred = *ppuVar2;
    ppuVar2 = ppuVar2 + (ulong)bVar4 * -2 + 1;
    pnVar3 = (neighbor_counter_pred *)((long)pnVar3 + ((ulong)bVar4 * -2 + 1) * 8);
  }
  stat_grid_counter(c,&local_158,L'\r',&nStack_1d8,L'\x01');
  counts->floor = local_158.in_vault_count;
  counts->upstair = local_138;
  counts->downstair = local_120;
  counts->trap = local_108;
  counts->lava = local_f0;
  counts->impass_rubble = local_d8;
  counts->pass_rubble = local_c0;
  counts->magma_treasure = local_a8;
  counts->quartz_treasure = local_90;
  counts->open_door = local_78;
  counts->closed_door = local_60;
  counts->broken_door = local_48;
  counts->secret_door = local_30;
  *(undefined8 *)counts->traversable_neighbor_histogram = nStack_1d8.vault_histogram._0_8_;
  *(undefined8 *)(counts->traversable_neighbor_histogram + 2) = nStack_1d8.vault_histogram._8_8_;
  *(undefined8 *)(counts->traversable_neighbor_histogram + 4) = nStack_1d8.vault_histogram._16_8_;
  *(undefined8 *)(counts->traversable_neighbor_histogram + 6) = nStack_1d8.vault_histogram._24_8_;
  counts->traversable_neighbor_histogram[8] = nStack_1d8.vault_histogram[8];
  counts[1].floor = local_158.in_room_count;
  counts[1].upstair = local_134;
  counts[1].downstair = local_11c;
  counts[1].trap = local_104;
  counts[1].lava = local_ec;
  counts[1].impass_rubble = local_d4;
  counts[1].pass_rubble = local_bc;
  counts[1].magma_treasure = local_a4;
  counts[1].quartz_treasure = local_8c;
  counts[1].open_door = local_74;
  counts[1].closed_door = local_5c;
  counts[1].broken_door = local_44;
  counts[1].secret_door = local_2c;
  *(undefined8 *)counts[1].traversable_neighbor_histogram = nStack_1d8.room_histogram._0_8_;
  *(undefined8 *)(counts[1].traversable_neighbor_histogram + 2) = nStack_1d8.room_histogram._8_8_;
  *(undefined8 *)(counts[1].traversable_neighbor_histogram + 4) = nStack_1d8.room_histogram._16_8_;
  *(undefined8 *)(counts[1].traversable_neighbor_histogram + 6) = nStack_1d8.room_histogram._24_8_;
  counts[1].traversable_neighbor_histogram[8] = nStack_1d8.room_histogram[8];
  counts[2].floor = local_158.in_other_count;
  counts[2].upstair = local_130;
  counts[2].downstair = local_118;
  counts[2].trap = local_100;
  counts[2].lava = local_e8;
  counts[2].impass_rubble = local_d0;
  counts[2].pass_rubble = local_b8;
  counts[2].magma_treasure = local_a0;
  counts[2].quartz_treasure = local_88;
  counts[2].open_door = local_70;
  counts[2].closed_door = local_58;
  counts[2].broken_door = local_40;
  counts[2].secret_door = local_28;
  *(undefined8 *)counts[2].traversable_neighbor_histogram = nStack_1d8.other_histogram._0_8_;
  *(undefined8 *)(counts[2].traversable_neighbor_histogram + 2) = nStack_1d8.other_histogram._8_8_;
  *(undefined8 *)(counts[2].traversable_neighbor_histogram + 4) = nStack_1d8.other_histogram._16_8_;
  *(undefined8 *)(counts[2].traversable_neighbor_histogram + 6) = nStack_1d8.other_histogram._24_8_;
  counts[2].traversable_neighbor_histogram[8] = nStack_1d8.other_histogram[8];
  return;
}

Assistant:

void stat_grid_counter_simple(struct chunk *c, struct grid_counts counts[3])
{
	struct grid_counter_pred gpreds[] = {
		{ square_isfloor, 0, 0, 0 },
		{ square_isupstairs, 0, 0, 0 },
		{ square_isdownstairs, 0, 0, 0 },
		{ is_floor_trap, 0, 0, 0 },
		{ square_isfiery, 0, 0, 0 },
		{ is_impassable_rubble, 0, 0, 0 },
		{ is_passable_rubble, 0, 0, 0 },
		{ is_magma_treasure, 0, 0, 0 },
		{ is_quartz_treasure, 0, 0, 0 },
		{ square_isopendoor, 0, 0, 0 },
		{ square_iscloseddoor, 0, 0, 0 },
		{ square_isbrokendoor, 0, 0, 0 },
		{ square_issecretdoor, 0, 0, 0 },
	};
	struct neighbor_counter_pred npreds[] = {
		{ is_easily_traversed, is_easily_traversed,
			{ 0, 0, 0, 0, 0, 0, 0, 0, 0 },
			{ 0, 0, 0, 0, 0, 0, 0, 0, 0 },
			{ 0, 0, 0, 0, 0, 0, 0, 0, 0 } },
	};
	int i;

	stat_grid_counter(c, gpreds, (int) N_ELEMENTS(gpreds),
		npreds, (int) N_ELEMENTS(npreds));
	counts[0].floor = gpreds[0].in_vault_count;
	counts[0].upstair = gpreds[1].in_vault_count;
	counts[0].downstair = gpreds[2].in_vault_count;
	counts[0].trap = gpreds[3].in_vault_count;
	counts[0].lava = gpreds[4].in_vault_count;
	counts[0].impass_rubble = gpreds[5].in_vault_count;
	counts[0].pass_rubble = gpreds[6].in_vault_count;
	counts[0].magma_treasure = gpreds[7].in_vault_count;
	counts[0].quartz_treasure = gpreds[8].in_vault_count;
	counts[0].open_door = gpreds[9].in_vault_count;
	counts[0].closed_door = gpreds[10].in_vault_count;
	counts[0].broken_door = gpreds[11].in_vault_count;
	counts[0].secret_door = gpreds[12].in_vault_count;
	for (i = 0; i < 9; ++i) {
		counts[0].traversable_neighbor_histogram[i] =
			npreds[0].vault_histogram[i];
	}
	counts[1].floor = gpreds[0].in_room_count;
	counts[1].upstair = gpreds[1].in_room_count;
	counts[1].downstair = gpreds[2].in_room_count;
	counts[1].trap = gpreds[3].in_room_count;
	counts[1].lava = gpreds[4].in_room_count;
	counts[1].impass_rubble = gpreds[5].in_room_count;
	counts[1].pass_rubble = gpreds[6].in_room_count;
	counts[1].magma_treasure = gpreds[7].in_room_count;
	counts[1].quartz_treasure = gpreds[8].in_room_count;
	counts[1].open_door = gpreds[9].in_room_count;
	counts[1].closed_door = gpreds[10].in_room_count;
	counts[1].broken_door = gpreds[11].in_room_count;
	counts[1].secret_door = gpreds[12].in_room_count;
	for (i = 0; i < 9; ++i) {
		counts[1].traversable_neighbor_histogram[i] =
			npreds[0].room_histogram[i];
	}
	counts[2].floor = gpreds[0].in_other_count;
	counts[2].upstair = gpreds[1].in_other_count;
	counts[2].downstair = gpreds[2].in_other_count;
	counts[2].trap = gpreds[3].in_other_count;
	counts[2].lava = gpreds[4].in_other_count;
	counts[2].impass_rubble = gpreds[5].in_other_count;
	counts[2].pass_rubble = gpreds[6].in_other_count;
	counts[2].magma_treasure = gpreds[7].in_other_count;
	counts[2].quartz_treasure = gpreds[8].in_other_count;
	counts[2].open_door = gpreds[9].in_other_count;
	counts[2].closed_door = gpreds[10].in_other_count;
	counts[2].broken_door = gpreds[11].in_other_count;
	counts[2].secret_door = gpreds[12].in_other_count;
	for (i = 0; i < 9; ++i) {
		counts[2].traversable_neighbor_histogram[i] =
			npreds[0].other_histogram[i];
	}
}